

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messaging.cpp
# Opt level: O2

void cancelRequest(Id *id)

{
  char *local_90;
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  local_88;
  Stack<rapidjson::CrtAllocator> local_48;
  
  local_88.os_ = (GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)&local_48;
  local_48.stack_ = (char *)0x0;
  local_48.stackTop_ = (char *)0x0;
  local_48.stackEnd_ = (char *)0x0;
  local_48.allocator_ = (CrtAllocator *)0x0;
  local_48.ownAllocator_ = (CrtAllocator *)0x0;
  local_48.initialCapacity_ = 0x100;
  local_88.level_stack_.allocator_ = (CrtAllocator *)0x0;
  local_88.level_stack_.ownAllocator_ = (CrtAllocator *)0x0;
  local_88.level_stack_.stackEnd_ = (char *)0x0;
  local_88.level_stack_.stack_ = (char *)0x0;
  local_88.level_stack_.stackTop_ = (char *)0x0;
  local_88.level_stack_.initialCapacity_ = 0x200;
  local_88.maxDecimalPlaces_ = 0x144;
  local_88.hasRoot_ = false;
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::StartObject(&local_88);
  local_90 = "jsonrpc";
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::Key(&local_88,&local_90);
  local_90 = "2.0";
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::String(&local_88,&local_90);
  local_90 = "method";
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::Key(&local_88,&local_90);
  local_90 = "$/cancelRequest";
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::String(&local_88,&local_90);
  local_90 = "params";
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::Key(&local_88,&local_90);
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::StartObject(&local_88);
  local_90 = "id";
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::Key(&local_88,&local_90);
  Id::writeId(id,&local_88);
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::EndObject(&local_88,0);
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::EndObject(&local_88,0);
  sendMessage((StringBuffer *)&local_48);
  rapidjson::internal::Stack<rapidjson::CrtAllocator>::~Stack(&local_88.level_stack_);
  rapidjson::internal::Stack<rapidjson::CrtAllocator>::~Stack(&local_48);
  return;
}

Assistant:

void cancelRequest (Id &id) {
    INIT_WRITER

    ADD_METHOD("$/cancelRequest");
    writer.Key("params"); writer.StartObject();
    ADD_ID(id);
    writer.EndObject();

    SEND_MESSAGE
}